

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropIndex(Parse *pParse,SrcList *pName,int ifExists)

{
  sqlite3 *db;
  Schema *pSVar1;
  Table *pTVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  Index *pIVar6;
  Vdbe *p;
  Schema **ppSVar7;
  char *zArg1;
  
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (iVar4 = sqlite3ReadSchema(pParse), iVar4 == 0)) {
    pIVar6 = sqlite3FindIndex(db,pName->a[0].zName,pName->a[0].zDatabase);
    if (pIVar6 == (Index *)0x0) {
      if (ifExists == 0) {
        sqlite3ErrorMsg(pParse,"no such index: %S",pName,0);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      }
      pParse->checkSchema = '\x01';
    }
    else if ((pIVar6->field_0x63 & 3) == 0) {
      if (pIVar6->pSchema == (Schema *)0x0) {
        iVar4 = -1000000;
      }
      else {
        iVar4 = -1;
        ppSVar7 = &db->aDb->pSchema;
        do {
          iVar4 = iVar4 + 1;
          pSVar1 = *ppSVar7;
          ppSVar7 = ppSVar7 + 4;
        } while (pSVar1 != pIVar6->pSchema);
      }
      pTVar2 = pIVar6->pTable;
      pcVar3 = db->aDb[iVar4].zDbSName;
      zArg1 = "sqlite_master";
      if (iVar4 == 1) {
        zArg1 = "sqlite_temp_master";
      }
      iVar5 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,pcVar3);
      if (((iVar5 == 0) &&
          (iVar5 = sqlite3AuthCheck(pParse,(uint)(iVar4 != 0) * 2 + 10,pIVar6->zName,pTVar2->zName,
                                    pcVar3), iVar5 == 0)) &&
         (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
        sqlite3BeginWriteOperation(pParse,1,iVar4);
        sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'index\'",
                           db->aDb[iVar4].zDbSName,"sqlite_master");
        sqlite3ClearStatTables(pParse,iVar4,"idx",pIVar6->zName);
        sqlite3ChangeCookie(pParse,iVar4);
        destroyRootPage(pParse,pIVar6->tnum,iVar4);
        pcVar3 = pIVar6->zName;
        iVar4 = sqlite3VdbeAddOp3(p,0x90,iVar4,0,0);
        sqlite3VdbeChangeP4(p,iVar4,pcVar3,0);
      }
    }
    else {
      sqlite3ErrorMsg(pParse,
                      "index associated with UNIQUE or PRIMARY KEY constraint cannot be dropped",0);
    }
  }
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropIndex(Parse *pParse, SrcList *pName, int ifExists){
  Index *pIndex;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  assert( pParse->nErr==0 );   /* Never called with prior errors */
  if( db->mallocFailed ){
    goto exit_drop_index;
  }
  assert( pName->nSrc==1 );
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_drop_index;
  }
  pIndex = sqlite3FindIndex(db, pName->a[0].zName, pName->a[0].zDatabase);
  if( pIndex==0 ){
    if( !ifExists ){
      sqlite3ErrorMsg(pParse, "no such index: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    }
    pParse->checkSchema = 1;
    goto exit_drop_index;
  }
  if( pIndex->idxType!=SQLITE_IDXTYPE_APPDEF ){
    sqlite3ErrorMsg(pParse, "index associated with UNIQUE "
      "or PRIMARY KEY constraint cannot be dropped", 0);
    goto exit_drop_index;
  }
  iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_INDEX;
    Table *pTab = pIndex->pTable;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      goto exit_drop_index;
    }
    if( !OMIT_TEMPDB && iDb ) code = SQLITE_DROP_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, code, pIndex->zName, pTab->zName, zDb) ){
      goto exit_drop_index;
    }
  }
#endif

  /* Generate code to remove the index and from the master table */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='index'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pIndex->zName
    );
    sqlite3ClearStatTables(pParse, iDb, "idx", pIndex->zName);
    sqlite3ChangeCookie(pParse, iDb);
    destroyRootPage(pParse, pIndex->tnum, iDb);
    sqlite3VdbeAddOp4(v, OP_DropIndex, iDb, 0, 0, pIndex->zName, 0);
  }

exit_drop_index:
  sqlite3SrcListDelete(db, pName);
}